

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.c
# Opt level: O2

int bmp_create_bool(char *filename,uint32_t w,uint32_t h,_Bool *data)

{
  int iVar1;
  void *__ptr;
  FILE *__s;
  _Bool *data_00;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  char cVar7;
  ulong __size;
  
  __size = (ulong)(w * h * 3 + 0x36);
  data_00 = data;
  __ptr = malloc(__size);
  create_header((char *)(ulong)w,h,(uint32_t)__ptr,data_00);
  iVar1 = 4 - (w & 3);
  if ((w & 3) == 0) {
    iVar1 = 0;
  }
  uVar2 = (h - 1) * w;
  iVar3 = 0x36;
  while (h = h - 1, -1 < (int)h) {
    lVar5 = (long)iVar3;
    uVar6 = uVar2;
    for (lVar4 = 0; (ulong)w * 3 != lVar4; lVar4 = lVar4 + 3) {
      cVar7 = data[uVar6] + -1;
      *(char *)((long)__ptr + lVar4 + lVar5) = cVar7;
      *(char *)((long)__ptr + lVar4 + lVar5 + 1) = cVar7;
      *(char *)((long)__ptr + lVar4 + lVar5 + 2) = cVar7;
      uVar6 = uVar6 + 1;
    }
    uVar2 = uVar2 - w;
    iVar3 = (int)lVar4 + iVar3 + iVar1;
  }
  __s = fopen(filename,"w");
  fwrite(__ptr,1,__size,__s);
  fclose(__s);
  free(__ptr);
  return 0;
}

Assistant:

int bmp_create_bool(char* filename, uint32_t w, uint32_t h, bool* data) {

	FILE *f;
	int index = 0;

	uint32_t filesize = BMP_FILE_HEADER_SIZE + BMP_INFO_HEADER_SIZE + w * h * 3;
	uint8_t* filedata = (uint8_t*)malloc(filesize);

	//Create header
	index += create_header(filename, w, h, filedata);

	//Write data
	for (int i = h - 1; i >= 0; i--) {
		for (int j = 0; j < w; j++) {
			if (data[i * w + j] == true) {
				filedata[index + 0] = 0x00;
				filedata[index + 1] = 0x00;
				filedata[index + 2] = 0x00;
			} else {
				filedata[index + 0] = 0xFF;
				filedata[index + 1] = 0xFF;
				filedata[index + 2] = 0xFF;
			}
			index += 3;
		}

		//Padding should ensure each section is word aligned
		//TODO: this is broken
		index += (w % 4 != 0) ? 4 - (w % 4) : 0;
	}

	//Write file
	f = fopen(filename, "w");
	fwrite(filedata, 1, filesize, f);
	fclose(f);

	free(filedata);

	return 0;
}